

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_unbreakable(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int idam;
  OBJ_DATA *pOVar2;
  CHAR_DATA *arg2;
  char *pcVar3;
  AFFECT_DATA af;
  
  if (vo == (void *)0x0) {
    vo = ch;
  }
  pOVar2 = get_eq_char((CHAR_DATA *)vo,0x10);
  if (pOVar2 == (OBJ_DATA *)0x0) {
    if ((CHAR_DATA *)vo == ch) {
      pcVar3 = "You are not wielding a weapon!";
      vo = (CHAR_DATA *)0x0;
    }
    else {
      pcVar3 = "$N is not wielding a weapon!";
    }
    act(pcVar3,ch,(void *)0x0,vo,3);
    return;
  }
  if ((CHAR_DATA *)vo == ch) {
    act("You painfully freeze your weapon to your hand!",ch,(void *)0x0,vo,3);
    pcVar3 = "$n\'s fist turns a rigid white as $e grips $s weapon tightly.";
    arg2 = (CHAR_DATA *)0x0;
  }
  else {
    act("You freeze $N\'s weapon to $S hand.",ch,(void *)0x0,vo,3);
    act("$n painfully freezes your weapon to your hand!",ch,(void *)0x0,vo,2);
    pcVar3 = "$N\'s fist turns a rigid white as $E grips $S weapon tightly.";
    arg2 = (CHAR_DATA *)vo;
  }
  act(pcVar3,ch,(void *)0x0,arg2,(uint)((CHAR_DATA *)vo != ch));
  idam = dice(6,9);
  damage_new(ch,(CHAR_DATA *)vo,idam,-1,5,true,false,0,1,"the intense cold*");
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_unbreakable);
  if (!bVar1) {
    init_affect(&af);
    af.where = 0;
    af.type = gsn_unbreakable;
    af.aftype = 0;
    af.duration = (short)(level / 4);
    af.location = 0;
    af.modifier = 0;
    af.level = (short)level;
    af.owner = ch;
    affect_to_char((CHAR_DATA *)vo,&af);
    return;
  }
  if ((CHAR_DATA *)vo != ch) {
    act("$N\'s weapon is already frozen to $S hand!",ch,(void *)0x0,vo,3);
    ch = (CHAR_DATA *)vo;
  }
  send_to_char("Your weapon is already frozen to your hand!\n\r",ch);
  return;
}

Assistant:

void spell_unbreakable(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	AFFECT_DATA af;

	if (victim == nullptr)
		victim = ch;

	obj = get_eq_char(victim, WEAR_WIELD);

	if (obj)
	{
		if (victim == ch)
		{
			act("You painfully freeze your weapon to your hand!", ch, 0, victim, TO_CHAR);
			act("$n's fist turns a rigid white as $e grips $s weapon tightly.", ch, 0, 0, TO_ROOM);
		}
		else
		{
			act("You freeze $N's weapon to $S hand.", ch, 0, victim, TO_CHAR);
			act("$n painfully freezes your weapon to your hand!", ch, 0, victim, TO_VICT);
			act("$N's fist turns a rigid white as $E grips $S weapon tightly.", ch, 0, victim, TO_NOTVICT);
		}
	}
	else
	{
		if (victim == ch)
			act("You are not wielding a weapon!", ch, 0, 0, TO_CHAR);
		else
			act("$N is not wielding a weapon!", ch, 0, victim, TO_CHAR);

		return;
	}

	damage_new(ch, victim, dice(6, 9), TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the intense cold*");

	if (is_affected(victim, gsn_unbreakable))
	{
		if (ch == victim)
		{
			send_to_char("Your weapon is already frozen to your hand!\n\r", ch);
			return;
		}
		else
		{
			act("$N's weapon is already frozen to $S hand!", ch, 0, victim, TO_CHAR);
			send_to_char("Your weapon is already frozen to your hand!\n\r", victim);
			return;
		}
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_unbreakable;
	af.aftype = AFT_SPELL;
	af.owner = ch;
	af.modifier = 0;
	af.duration = level / 4;
	af.location = 0;
	af.level = level;
	affect_to_char(victim, &af);
}